

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O1

SourceDynamicProfileManager *
Js::SourceDynamicProfileManager::Deserialize<Js::BufferReader>
          (BufferReader *reader,Recycler *recycler)

{
  BVIndex length;
  code *pcVar1;
  bool bVar2;
  BVFixed *this;
  size_t len;
  ThreadContext *pTVar3;
  Recycler *alloc;
  SourceDynamicProfileManager *this_00;
  undefined4 *puVar4;
  uint uVar5;
  uint lineNumber;
  undefined1 local_70 [8];
  TrackAllocData data;
  uint local_3c;
  uint local_38;
  uint profileCount;
  LocalFunctionId functionId;
  
  if (reader->lengthLeft < 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    lineNumber = 0x145;
  }
  else {
    length = *(BVIndex *)reader->current;
    profileCount = length;
    this = BVFixed::New<Memory::Recycler>(length,recycler,false);
    len = BVFixed::GetAllocSize(length);
    bVar2 = BufferReader::ReadArray<char>(reader,(char *)this,len);
    if (bVar2) {
      bVar2 = BufferReader::Read<unsigned_int>(reader,&local_3c);
      if (bVar2) {
        pTVar3 = ThreadContext::GetContextForCurrentThread();
        local_70 = (undefined1  [8])&typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_592d864;
        data.filename._0_4_ = 0x15b;
        alloc = Memory::Recycler::TrackAllocInfo(pTVar3->recycler,(TrackAllocData *)local_70);
        this_00 = (SourceDynamicProfileManager *)new<Memory::Recycler>(0x98,alloc,0x38bbb2);
        SourceDynamicProfileManager(this_00,recycler);
        Memory::Recycler::WBSetBit((char *)&this_00->cachedStartupFunctions);
        (this_00->cachedStartupFunctions).ptr = this;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->cachedStartupFunctions);
        bVar2 = Phases::IsEnabled((Phases *)&DAT_015ad2f8,DynamicProfilePhase);
        if (bVar2) {
          Output::Print(L"Loaded: Startup functions bit vector:");
          BVFixed::Dump(this);
        }
        if (local_3c == 0) {
          return this_00;
        }
        uVar5 = 0;
        data._32_8_ = recycler;
        while ((local_70 = (undefined1  [8])
                           DynamicProfileInfo::Deserialize<Js::BufferReader>
                                     (reader,(Recycler *)data._32_8_,&local_38),
               local_70 != (undefined1  [8])0x0 && (local_38 < profileCount))) {
          JsUtil::
          BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&this_00->dynamicProfileInfoMap,&local_38,(DynamicProfileInfo **)local_70);
          AddSavingItem(this_00,local_38,(DynamicProfileInfo *)local_70);
          uVar5 = uVar5 + 1;
          if (local_3c <= uVar5) {
            return this_00;
          }
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        lineNumber = 0x16d;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        lineNumber = 0x155;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      lineNumber = 0x14d;
    }
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                              ,lineNumber,"(false)","false");
  if (bVar2) {
    *puVar4 = 0;
    return (SourceDynamicProfileManager *)0x0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

SourceDynamicProfileManager *
    SourceDynamicProfileManager::Deserialize(T * reader, Recycler* recycler)
    {
        uint functionCount;
        if (!reader->Peek(&functionCount))
        {
            Assert(false);
            return nullptr;
        }

        BVFixed * startupFunctions = BVFixed::New(functionCount, recycler);
        if (!reader->ReadArray(((char *)startupFunctions),
            BVFixed::GetAllocSize(functionCount)))
        {
            Assert(false);
            return nullptr;
        }

        uint profileCount;

        if (!reader->Read(&profileCount))
        {
            Assert(false);
            return nullptr;
        }

        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();

        SourceDynamicProfileManager * sourceDynamicProfileManager = RecyclerNew(threadContext->GetRecycler(), SourceDynamicProfileManager, recycler);

        sourceDynamicProfileManager->cachedStartupFunctions = startupFunctions;

#if DBG_DUMP
        if(Configuration::Global.flags.Dump.IsEnabled(DynamicProfilePhase))
        {
            Output::Print(_u("Loaded: Startup functions bit vector:"));
            startupFunctions->Dump();
        }
#endif

        for (uint i = 0; i < profileCount; i++)
        {
            Js::LocalFunctionId functionId;
            DynamicProfileInfo * dynamicProfileInfo = DynamicProfileInfo::Deserialize(reader, recycler, &functionId);
            if (dynamicProfileInfo == nullptr || functionId >= functionCount)
            {
                Assert(false);
                return nullptr;
            }
            sourceDynamicProfileManager->dynamicProfileInfoMap.Add(functionId, dynamicProfileInfo);
            sourceDynamicProfileManager->AddSavingItem(functionId, dynamicProfileInfo);
        }
        return sourceDynamicProfileManager;
    }